

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmShiftEa<(moira::Instr)70,(moira::Mode)6,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  Ea<(moira::Mode)6,_2> src;
  Ea<(moira::Mode)6,_2> local_1c;
  
  Op<(moira::Mode)6,2>(&local_1c,this,op & 7,addr);
  cVar3 = 'l';
  lVar4 = 1;
  do {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar3;
    cVar3 = "lsr"[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (str->style->syntax - MOIRA_MIT < 3) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = 'w';
  }
  else {
    cVar3 = '.';
    lVar4 = 0;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar3;
      cVar3 = "$%x.w"[lVar4 + 4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
  }
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    } while (str->ptr < str->base + iVar1);
  }
  StrWriter::operator<<(str,&local_1c);
  return;
}

Assistant:

void
Moira::dasmShiftEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src;
}